

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall booster::locale::calendar::calendar(calendar *this,string *zone)

{
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  string *in_RSI;
  locale *in_RDI;
  locale *this_00;
  locale local_28 [3];
  string *local_10;
  
  local_10 = in_RSI;
  std::locale::locale(in_RDI);
  std::__cxx11::string::string((string *)(in_RDI + 1),local_10);
  this_00 = local_28;
  std::locale::locale(this_00);
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(this_00);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))();
  hold_ptr<booster::locale::abstract_calendar>::hold_ptr
            ((hold_ptr<booster::locale::abstract_calendar> *)(in_RDI + 5),paVar2);
  std::locale::~locale(local_28);
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->
                     ((hold_ptr<booster::locale::abstract_calendar> *)(in_RDI + 5));
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,in_RDI + 1);
  return;
}

Assistant:

calendar::calendar(std::string const &zone) :
    tz_(zone),
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(tz_);
}